

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_generate_ttf_font_atlas
          (rf_image *__return_storage_ptr__,rf_ttf_font_info *font_info,int atlas_width,int padding,
          rf_glyph_info *glyphs,rf_int glyphs_count,rf_font_antialias antialias,unsigned_short *dst,
          rf_int dst_count,rf_allocator temp_allocator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  stbtt__point sVar5;
  stbtt__point sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  byte bVar10;
  float *pfVar11;
  byte bVar12;
  rf_source_location rVar13;
  rf_source_location rVar14;
  rf_allocator_args rVar15;
  undefined1 auVar16 [24];
  stbtt_vertex *psVar17;
  stbtt_fontinfo *info;
  int iVar18;
  uint uVar19;
  undefined4 extraout_EAX;
  int iVar20;
  stbtt__active_edge *z;
  stbtt__point *points;
  stbtt__edge *psVar21;
  float *pfVar22;
  float *pfVar23;
  stbtt__active_edge *psVar24;
  stbtt__active_edge *psVar25;
  int iVar26;
  undefined4 in_register_0000000c;
  ulong uVar27;
  stbtt__active_edge *psVar28;
  long lVar29;
  int iVar30;
  rf_glyph_info *prVar31;
  uint x;
  undefined1 uVar32;
  long lVar33;
  stbtt__edge *psVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  int iVar39;
  void *p;
  stbtt__active_edge *psVar40;
  long lVar41;
  ulong uVar42;
  undefined1 (*pauVar43) [16];
  long *in_FS_OFFSET;
  bool bVar44;
  bool bVar45;
  float sum;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar49 [16];
  float in_XMM2_Da;
  float fVar50;
  float in_XMM3_Da;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float y0;
  int local_49c;
  ulong local_498;
  stbtt__active_edge *local_490;
  char *pcStack_488;
  ulong local_480;
  undefined1 (*local_478) [16];
  uint local_470;
  int local_46c;
  float *local_468;
  char *pcStack_460;
  undefined8 local_458;
  stbtt__active_edge *local_450;
  float local_444;
  stbtt__edge *local_440;
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  rf_glyph_info *local_410;
  float *local_408;
  uint local_3fc;
  int local_3f8;
  int local_3f4;
  float *local_3f0;
  stbtt__point *local_3e8;
  char *pcStack_3e0;
  ulong local_3d8;
  rf_ttf_font_info *local_3d0;
  stbtt__point *local_3c8;
  ulong local_3c0;
  float local_3b8;
  float local_3b4;
  int local_3b0;
  int local_3ac;
  float local_3a8;
  float local_3a4;
  int iy0;
  int ix0;
  stbtt__active_edge *active;
  undefined8 uStack_390;
  float local_388;
  char *local_380;
  char *pcStack_378;
  ulong local_370;
  char *local_368;
  char *pcStack_360;
  ulong local_358;
  rf_image *local_350;
  undefined8 local_348;
  ulong local_340;
  ulong local_338;
  void *local_330;
  long local_328;
  stbtt_vertex *vertices;
  char *local_318;
  char *pcStack_310;
  ulong local_308;
  undefined1 local_2f8 [16];
  ulong local_2e8;
  stbtt_fontinfo *local_2e0;
  ulong local_2d8;
  long local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  ulong local_2b8;
  stbtt__edge *local_2b0;
  long local_2a8;
  long local_2a0;
  void *local_298;
  undefined8 uStack_290;
  undefined4 local_288;
  uint uStack_284;
  char *local_280;
  char *pcStack_278;
  undefined8 local_270;
  undefined8 local_268;
  ulong uStack_260;
  undefined4 local_258;
  uint uStack_254;
  char *local_250;
  char *pcStack_248;
  undefined8 local_240;
  float scanline_data [129];
  
  local_348 = CONCAT44(in_register_0000000c,padding);
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  local_350 = __return_storage_ptr__;
  if (((font_info != (rf_ttf_font_info *)0x0) && (font_info->valid == true)) &&
     ((long)(ulong)(uint)(atlas_width * atlas_width) <= dst_count && dst != (unsigned_short *)0x0))
  {
    uVar27 = 0;
    local_470 = atlas_width;
    local_3d0 = font_info;
    memset(dst,0,(ulong)(uint)(atlas_width * atlas_width * 2));
    local_2d8 = glyphs_count;
    if (glyphs_count < 1) {
      local_2d8 = uVar27;
    }
    pfVar22 = &(glyphs->field_0).rec.height;
    uVar42 = local_2d8;
    while( true ) {
      bVar44 = uVar42 == 0;
      uVar42 = uVar42 - 1;
      if (bVar44) break;
      if ((int)uVar27 <= (int)(pfVar22[-1] * *pfVar22)) {
        uVar27 = (ulong)(uint)(int)(pfVar22[-1] * *pfVar22);
      }
      pfVar22 = pfVar22 + 8;
    }
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_248 = "rf_generate_ttf_font_atlas";
    local_240 = 0x5bc7;
    local_268 = 0;
    local_258 = 0;
    rVar13.proc_name = "rf_generate_ttf_font_atlas";
    rVar13.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar13.line_in_file = 0x5bc7;
    auVar16._8_8_ = (ulong)uStack_254 << 0x20;
    auVar16._0_8_ = uVar27;
    auVar16._16_8_ = 0;
    local_410 = glyphs;
    uStack_260 = uVar27;
    local_298 = (*temp_allocator.allocator_proc)
                          (&temp_allocator,rVar13,RF_AM_ALLOC,(rf_allocator_args)(auVar16 << 0x40));
    if (local_298 != (void *)0x0) {
      pauVar43 = (undefined1 (*) [16])(*in_FS_OFFSET + -0x430);
      in_FS_OFFSET[-0x86] = (long)temp_allocator.user_data;
      in_FS_OFFSET[-0x85] = (long)temp_allocator.allocator_proc;
      local_2e0 = (stbtt_fontinfo *)&local_3d0->internal_stb_font_info;
      local_3b4 = (float)((int)local_348 * 2);
      local_2e8 = (ulong)local_470;
      local_3b8 = (float)(int)local_470;
      local_2a8 = local_2e8 << 0x20;
      iVar18 = 2;
      uVar27 = 0;
      local_46c = 2;
      prVar31 = local_410;
      local_478 = pauVar43;
      local_330 = local_298;
LAB_00130b01:
      info = local_2e0;
      if (uVar27 != local_2d8) {
        lVar41 = uVar27 * 0x20;
        local_438 = ZEXT416((uint)local_3d0->scale_factor);
        local_3f8 = iVar18;
        local_338 = uVar27;
        iVar18 = stbtt_FindGlyphIndex(local_2e0,prVar31[uVar27].codepoint);
        uVar4 = *(undefined8 *)((long)&prVar31[uVar27].field_0 + 8);
        local_428._4_4_ = (int)(float)((ulong)uVar4 >> 0x20);
        local_428._0_4_ = (int)(float)uVar4;
        local_428._8_8_ = 0;
        uVar19 = stbtt_GetGlyphShape(info,iVar18,&vertices);
        stbtt_GetGlyphBitmapBoxSubpixel
                  (info,iVar18,(float)local_438._0_4_,(float)local_438._0_4_,in_XMM2_Da,in_XMM3_Da,
                   &ix0,&iy0,(int *)0x0,(int *)0x0);
        psVar17 = vertices;
        iVar18 = ix0;
        auVar49._0_4_ = -(uint)(local_428._0_4_ == 0);
        auVar49._4_4_ = -(uint)(local_428._0_4_ == 0);
        auVar49._8_4_ = -(uint)(local_428._4_4_ == 0);
        auVar49._12_4_ = -(uint)(local_428._4_4_ == 0);
        iVar20 = movmskpd(extraout_EAX,auVar49);
        prVar31 = local_410;
        if (iVar20 == 0) {
          local_340 = (ulong)(uint)iy0;
          uVar42 = 0;
          uVar27 = (ulong)uVar19;
          if ((int)uVar19 < 1) {
            uVar27 = uVar42;
          }
          uVar19 = 0;
          for (; uVar27 * 0xe - uVar42 != 0; uVar42 = uVar42 + 0xe) {
            uVar19 = uVar19 + ((&vertices->type)[uVar42] == '\x01');
          }
          if (uVar19 != 0) {
            scanline_data._0_8_ = anon_var_dwarf_10442;
            local_490 = (stbtt__active_edge *)0x0;
            scanline_data[2] = 2.140981e-39;
            scanline_data[3] = 0.0;
            scanline_data[4] = 3.07333e-41;
            scanline_data[5] = 0.0;
            local_498 = (ulong)uVar19;
            pcStack_488 = (char *)(local_498 * 4);
            local_480 = local_480 & 0xffffffff00000000;
            local_450 = (stbtt__active_edge *)(*(code *)in_FS_OFFSET[-0x85])();
            prVar31 = local_410;
            if (local_450 != (stbtt__active_edge *)0x0) {
              fVar46 = (0.35 / (float)local_438._0_4_) * (0.35 / (float)local_438._0_4_);
              points = (stbtt__point *)0x0;
              iVar30 = 0;
              iVar26 = 0;
              iVar20 = 0;
              local_328 = lVar41;
              do {
                lVar41 = local_328;
                prVar31 = local_410;
                pauVar43 = local_478;
                if (iVar26 == 1) {
                  local_468 = (float *)0x1725fc;
                  local_3e8 = (stbtt__point *)0x0;
                  pcStack_460 = "stbtt_FlattenCurves";
                  local_458 = 0x55b7;
                  pcStack_3e0 = (char *)((long)iVar20 << 3);
                  local_3d8 = local_3d8 & 0xffffffff00000000;
                  points = (stbtt__point *)(*(code *)in_FS_OFFSET[-0x85])(local_478,1);
                  pauVar43 = local_478;
                  if (points == (stbtt__point *)0x0) {
                    local_368 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ;
                    pcStack_360 = "stbtt_FlattenCurves";
                    local_358 = 0x55e2;
                    local_318 = (char *)0x0;
                    pcStack_310 = (char *)0x0;
                    local_308 = local_308 & 0xffffffff00000000;
                    (*(code *)in_FS_OFFSET[-0x85])(local_478,3);
                    local_380 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
                    ;
                    pcStack_378 = "stbtt_FlattenCurves";
                    active = local_450;
                    uStack_390._0_4_ = 0.0;
                    uStack_390._4_4_ = 0.0;
                    local_370 = 0x55e3;
                    local_388 = 0.0;
                    (*(code *)in_FS_OFFSET[-0x85])(pauVar43,3);
                    prVar31 = local_410;
                    break;
                  }
                }
                else if (iVar26 == 2) goto LAB_00130f37;
                local_49c = 0;
                fVar47 = 0.0;
                fVar50 = 0.0;
                uVar19 = 0xffffffff;
                for (lVar41 = 0; uVar27 * 0xe - lVar41 != 0; lVar41 = lVar41 + 0xe) {
                  iVar20 = local_49c;
                  switch((&psVar17->type)[lVar41]) {
                  case '\x01':
                    if (-1 < (int)uVar19) {
                      *(int *)((long)&local_450->next + (ulong)uVar19 * 4) = local_49c - iVar30;
                    }
                    uVar19 = uVar19 + 1;
                    auVar49 = ZEXT416(*(uint *)((long)&psVar17->x + lVar41));
                    auVar49 = pshuflw(auVar49,auVar49,0x60);
                    fVar47 = (float)(auVar49._0_4_ >> 0x10);
                    fVar50 = (float)(auVar49._4_4_ >> 0x10);
                    iVar30 = local_49c;
                    iVar20 = local_49c + 1;
                    if (points != (stbtt__point *)0x0) {
                      points[local_49c].x = fVar47;
                      points[local_49c].y = fVar50;
                    }
                    break;
                  case '\x02':
                    auVar49 = ZEXT416(*(uint *)((long)&psVar17->x + lVar41));
                    auVar49 = pshuflw(auVar49,auVar49,0x60);
                    fVar47 = (float)(auVar49._0_4_ >> 0x10);
                    fVar50 = (float)(auVar49._4_4_ >> 0x10);
                    iVar20 = local_49c + 1;
                    if (points != (stbtt__point *)0x0) {
                      points[local_49c].x = fVar47;
                      points[local_49c].y = fVar50;
                    }
                    break;
                  case '\x03':
                    stbtt__tesselate_curve
                              (points,&local_49c,fVar47,fVar50,
                               (float)(int)*(short *)((long)&psVar17->cx + lVar41),
                               (float)(int)*(short *)((long)&psVar17->cy + lVar41),
                               (float)(int)*(short *)((long)&psVar17->x + lVar41),
                               (float)(int)*(short *)((long)&psVar17->y + lVar41),fVar46,0);
                    goto LAB_00130eb0;
                  case '\x04':
                    stbtt__tesselate_cubic
                              (points,&local_49c,fVar47,fVar50,
                               (float)(int)*(short *)((long)&psVar17->cx + lVar41),
                               (float)(int)*(short *)((long)&psVar17->cy + lVar41),
                               (float)(int)*(short *)((long)&psVar17->cx1 + lVar41),
                               (float)(int)*(short *)((long)&psVar17->cy1 + lVar41),
                               (float)(int)*(short *)((long)&psVar17->x + lVar41),
                               (float)(int)*(short *)((long)&psVar17->y + lVar41),fVar46,0);
LAB_00130eb0:
                    auVar49 = ZEXT416(*(uint *)((long)&psVar17->x + lVar41));
                    auVar49 = pshuflw(auVar49,auVar49,0x60);
                    fVar47 = (float)(auVar49._0_4_ >> 0x10);
                    fVar50 = (float)(auVar49._4_4_ >> 0x10);
                    iVar20 = local_49c;
                  }
                  local_49c = iVar20;
                }
                *(int *)((long)&local_450->next + (long)(int)uVar19 * 4) = local_49c - iVar30;
                iVar26 = iVar26 + 1;
                iVar20 = local_49c;
              } while( true );
            }
          }
        }
        goto LAB_00131078;
      }
LAB_0013214b:
      *pauVar43 = ZEXT416(0);
      local_350->data = dst;
      local_350->width = local_470;
      local_350->height = local_470;
      local_350->format = RF_UNCOMPRESSED_GRAY_ALPHA;
      local_350->valid = true;
      local_298 = local_330;
    }
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_278 = "rf_generate_ttf_font_atlas";
    uStack_290 = 0;
    local_270 = 0x5c05;
    local_288 = 0;
    rVar14.proc_name = "rf_generate_ttf_font_atlas";
    rVar14.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar14.line_in_file = 0x5c05;
    rVar15.size_to_allocate_or_reallocate = 0;
    rVar15.pointer_to_free_or_realloc = local_298;
    rVar15._16_8_ = (ulong)uStack_284 << 0x20;
    (*temp_allocator.allocator_proc)(&temp_allocator,rVar14,RF_AM_FREE,rVar15);
  }
  return local_350;
LAB_00130f37:
  if (points != (stbtt__point *)0x0) {
    iVar20 = 0;
    for (uVar27 = 0; local_498 != uVar27; uVar27 = uVar27 + 1) {
      iVar20 = iVar20 + *(int *)((long)&local_450->next + uVar27 * 4);
    }
    local_318 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_310 = "stbtt__rasterize";
    local_380 = (char *)0x0;
    local_308 = 0x552f;
    pcStack_378 = (char *)((long)(iVar20 + 1) * 0x14);
    local_370 = local_370 & 0xffffffff00000000;
    local_3c8 = points;
    psVar21 = (stbtt__edge *)(*(code *)in_FS_OFFSET[-0x85])(local_478,1);
    local_440 = psVar21;
    if (psVar21 != (stbtt__edge *)0x0) {
      iVar20 = 0;
      iVar30 = 0;
      for (uVar27 = 0; uVar27 != local_498; uVar27 = uVar27 + 1) {
        iVar26 = *(int *)((long)&local_450->next + uVar27 * 4);
        uVar38 = (ulong)(iVar26 - 1);
        iVar39 = iVar26;
        for (uVar42 = 0; iVar36 = (int)uVar38, (long)uVar42 < (long)iVar39; uVar42 = uVar42 + 1) {
          fVar46 = local_3c8[(long)iVar20 + (long)iVar36].y;
          fVar47 = local_3c8[(long)iVar20 + uVar42].y;
          if ((fVar46 != fVar47) || (NAN(fVar46) || NAN(fVar47))) {
            iVar37 = (int)uVar42;
            iVar39 = iVar36;
            if (fVar46 <= fVar47) {
              iVar39 = iVar37;
              iVar37 = iVar36;
            }
            psVar21[iVar30].invert = (uint)(fVar47 < fVar46);
            sVar5 = local_3c8[(long)iVar20 + (long)iVar39];
            sVar6 = local_3c8[(long)iVar20 + (long)iVar37];
            psVar34 = psVar21 + iVar30;
            psVar34->x0 = sVar5.x * (float)local_438._0_4_ + 0.0;
            psVar34->y0 = sVar5.y * -(float)local_438._0_4_ + 0.0;
            psVar34->x1 = sVar6.x * (float)local_438._0_4_ + 0.0;
            psVar34->y1 = sVar6.y * -(float)local_438._0_4_ + 0.0;
            iVar30 = iVar30 + 1;
            iVar39 = *(int *)((long)&local_450->next + uVar27 * 4);
          }
          uVar38 = uVar42 & 0xffffffff;
        }
        iVar20 = iVar26 + iVar20;
      }
      stbtt__sort_edges_quicksort(psVar21,iVar30);
      for (uVar27 = 1; (long)uVar27 < (long)iVar30; uVar27 = uVar27 + 1) {
        uVar1 = local_440[uVar27].x0;
        uVar7 = local_440[uVar27].y0;
        scanline_data[2] = (float)local_440[uVar27].invert;
        scanline_data[0] = local_440[uVar27].x1;
        scanline_data[1] = local_440[uVar27].y1;
        psVar34 = psVar21;
        for (uVar42 = uVar27; 0 < (long)uVar42; uVar42 = uVar42 - 1) {
          if (psVar34->y0 <= (float)uVar7) goto LAB_00131458;
          psVar34[1].invert = psVar34->invert;
          fVar46 = psVar34->y0;
          fVar47 = psVar34->x1;
          fVar50 = psVar34->y1;
          psVar34[1].x0 = psVar34->x0;
          psVar34[1].y0 = fVar46;
          psVar34[1].x1 = fVar47;
          psVar34[1].y1 = fVar50;
          psVar34 = psVar34 + -1;
        }
        uVar42 = 0;
LAB_00131458:
        iVar20 = (int)uVar42;
        if (uVar27 != (uVar42 & 0xffffffff)) {
          local_440[iVar20].x0 = (float)uVar1;
          local_440[iVar20].y0 = (float)uVar7;
          local_440[iVar20].x1 = scanline_data[0];
          local_440[iVar20].y1 = scanline_data[1];
          local_440[iVar20].invert = (int)scanline_data[2];
        }
        psVar21 = psVar21 + 1;
      }
      active = (stbtt__active_edge *)0x0;
      pfVar22 = scanline_data;
      local_3fc = local_428._0_4_;
      if (0x40 < (int)local_428._0_4_) {
        local_3e8 = (stbtt__point *)0x1725fc;
        local_368 = (char *)0x0;
        pcStack_3e0 = "stbtt__rasterize_sorted_edges";
        local_3d8 = 0x5465;
        pcStack_360 = (char *)((ulong)(uint)local_428._0_4_ * 8 + 4);
        local_358 = local_358 & 0xffffffff00000000;
        pfVar22 = (float *)(*(code *)in_FS_OFFSET[-0x85])(local_478,1);
      }
      local_2a0 = (long)(int)local_3fc;
      local_408 = pfVar22 + local_2a0;
      local_3a8 = (float)iVar18;
      local_440[iVar30].y0 = (float)((int)local_340 + local_428._4_4_) + 1.0;
      local_444 = (float)(int)local_3fc;
      local_2c0 = local_2a0 * 4;
      local_2c8 = local_2a0 * 4 + 4;
      uVar19 = 0;
      if (0 < (int)local_3fc) {
        uVar19 = local_3fc;
      }
      local_2d0 = 0;
      if (0 < local_2a0) {
        local_2d0 = local_2a0;
      }
      local_3c0 = 0;
      local_2b8 = (ulong)(uint)local_428._4_4_;
      if ((int)local_428._4_4_ < 1) {
        local_2b8 = 0;
      }
      psVar24 = (stbtt__active_edge *)0x0;
      local_3f0 = (float *)0x0;
      uVar27 = local_340 & 0xffffffff;
      iVar20 = 0;
      psVar21 = local_440;
      iVar18 = 0;
      while (pfVar23 = local_3f0, iVar20 != (int)local_2b8) {
        local_3ac = (int)uVar27;
        fVar46 = (float)local_3ac;
        local_3f4 = iVar20;
        memset(pfVar22,0,local_2c0);
        memset(local_408,0,local_2c8);
        psVar25 = (stbtt__active_edge *)&active;
        while (psVar28 = psVar25, psVar40 = psVar28->next, psVar40 != (stbtt__active_edge *)0x0) {
          psVar25 = psVar40;
          if (psVar40->ey <= fVar46) {
            psVar28->next = psVar40->next;
            psVar40->direction = 0.0;
            psVar40->next = psVar24;
            psVar25 = psVar28;
            psVar24 = psVar40;
          }
        }
        bVar44 = (int)local_340 != 0;
        fVar47 = fVar46 + 1.0;
        bVar45 = local_3f4 == 0;
        for (; fVar50 = psVar21->y0, fVar50 <= fVar47; psVar21 = psVar21 + 1) {
          if ((fVar50 != psVar21->y1) || (NAN(fVar50) || NAN(psVar21->y1))) {
            if (psVar24 == (stbtt__active_edge *)0x0) {
              if (iVar18 == 0) {
                local_490 = (stbtt__active_edge *)0x1725fc;
                pcStack_488 = "stbtt__hheap_alloc";
                local_480 = 0x529c;
                local_468 = (float *)0x0;
                pcStack_460 = (char *)0x6408;
                local_458 = local_458 & 0xffffffff00000000;
                pfVar23 = (float *)(*(code *)in_FS_OFFSET[-0x85])(local_478);
                if (pfVar23 == (float *)0x0) {
                  psVar24 = (stbtt__active_edge *)0x0;
                  iVar18 = 0;
                  goto LAB_001318b3;
                }
                *(float **)pfVar23 = local_3f0;
                iVar18 = 799;
                local_3f0 = pfVar23;
              }
              else {
                iVar18 = iVar18 + -1;
              }
              psVar40 = (stbtt__active_edge *)(local_3f0 + (long)iVar18 * 8 + 2);
              psVar25 = (stbtt__active_edge *)0x0;
            }
            else {
              psVar25 = psVar24->next;
              psVar40 = psVar24;
            }
            psVar24 = psVar25;
            uVar2 = psVar21->x0;
            uVar8 = psVar21->y0;
            uVar3 = psVar21->x1;
            uVar9 = psVar21->y1;
            fVar50 = ((float)uVar3 - (float)uVar2) / ((float)uVar9 - (float)uVar8);
            psVar40->fdx = fVar50;
            psVar40->fdy = (float)(-(uint)(fVar50 != 0.0) & (uint)(1.0 / fVar50));
            psVar40->fx = ((fVar46 - (float)uVar8) * fVar50 + (float)uVar2) - local_3a8;
            psVar40->direction = *(float *)(&DAT_0016fa70 + (ulong)(psVar21->invert == 0) * 4);
            psVar40->sy = (float)uVar8;
            psVar40->ey = (float)uVar9;
            psVar40->next = (stbtt__active_edge *)0x0;
            if ((float)uVar9 < fVar46 && (bVar45 && bVar44)) {
              psVar40->ey = fVar46;
            }
            psVar40->next = active;
            active = psVar40;
          }
LAB_001318b3:
        }
        local_3b0 = iVar18;
        if (active != (stbtt__active_edge *)0x0) {
          local_2b0 = psVar21;
          for (psVar25 = active; psVar21 = local_2b0, psVar25 != (stbtt__active_edge *)0x0;
              psVar25 = psVar25->next) {
            fVar48 = psVar25->fx;
            fVar50 = psVar25->fdx;
            if ((fVar50 != 0.0) || (NAN(fVar50))) {
              fVar56 = fVar50 + fVar48;
              fVar57 = psVar25->sy;
              fVar51 = (float)(~-(uint)(fVar46 < fVar57) & (uint)fVar48 |
                              (uint)((fVar57 - fVar46) * fVar50 + fVar48) & -(uint)(fVar46 < fVar57)
                              );
              if (0.0 <= fVar51) {
                fVar52 = psVar25->ey;
                fVar55 = (float)(-(uint)(fVar52 < fVar47) &
                                 (uint)((fVar52 - fVar46) * fVar50 + fVar48) |
                                ~-(uint)(fVar52 < fVar47) & (uint)fVar56);
                if (((0.0 <= fVar55) && (fVar51 < local_444)) && (fVar55 < local_444)) {
                  if (fVar57 <= fVar46) {
                    fVar57 = fVar46;
                  }
                  iVar18 = (int)fVar51;
                  if (fVar47 <= fVar52) {
                    fVar52 = fVar47;
                  }
                  iVar20 = (int)fVar55;
                  if (iVar18 == iVar20) {
                    lVar41 = (long)iVar18;
                    pfVar22[lVar41] =
                         (((fVar55 - (float)iVar18) + (fVar51 - (float)iVar18)) * -0.5 + 1.0) *
                         psVar25->direction * (fVar52 - fVar57) + pfVar22[lVar41];
                    fVar48 = (fVar52 - fVar57) * psVar25->direction;
                  }
                  else {
                    fVar50 = psVar25->fdy;
                    fVar54 = fVar55;
                    iVar30 = iVar18;
                    if (fVar55 < fVar51) {
                      fVar53 = fVar46 - fVar57;
                      fVar57 = (fVar46 - fVar52) + fVar47;
                      fVar50 = -fVar50;
                      fVar54 = fVar51;
                      fVar48 = fVar56;
                      iVar30 = iVar20;
                      iVar20 = iVar18;
                      fVar52 = fVar53 + fVar47;
                      fVar51 = fVar55;
                    }
                    iVar18 = iVar30 + 1;
                    fVar55 = ((float)iVar18 - fVar48) * fVar50 + fVar46;
                    fVar48 = psVar25->direction;
                    fVar56 = (fVar55 - fVar57) * fVar48;
                    pfVar22[iVar30] =
                         (1.0 - ((fVar51 - (float)iVar30) + 1.0) * 0.5) * fVar56 + pfVar22[iVar30];
                    lVar41 = (long)iVar20;
                    for (lVar35 = (long)iVar18; lVar35 < lVar41; lVar35 = lVar35 + 1) {
                      pfVar22[lVar35] = fVar50 * fVar48 * 0.5 + fVar56 + pfVar22[lVar35];
                      fVar56 = fVar56 + fVar50 * fVar48;
                    }
                    pfVar22[lVar41] =
                         (fVar52 - (fVar50 * (float)(iVar20 - iVar18) + fVar55)) *
                         (((fVar54 - (float)iVar20) + 0.0) * -0.5 + 1.0) * fVar48 + fVar56 +
                         pfVar22[lVar41];
                    fVar48 = (fVar52 - fVar57) * fVar48;
                  }
                  local_408[lVar41 + 1] = fVar48 + local_408[lVar41 + 1];
                  goto LAB_00131dd1;
                }
              }
              local_2f8 = ZEXT416((uint)fVar48);
              local_428 = ZEXT416((uint)fVar56);
              x = 0;
              local_3a4 = fVar50;
              while (uVar19 != x) {
                fVar52 = (float)(int)x;
                fVar57 = (float)(int)(x + 1);
                fVar50 = (fVar52 - fVar48) / local_3a4 + fVar46;
                fVar51 = (fVar57 - fVar48) / local_3a4 + fVar46;
                if ((fVar52 <= fVar48) || (fVar56 <= fVar57)) {
                  if ((fVar56 < fVar52) && (fVar57 < fVar48)) {
                    local_498 = CONCAT44(local_498._4_4_,fVar57);
                    local_438._0_4_ = fVar51;
                    stbtt__handle_clipped_edge(pfVar22,x,psVar25,fVar48,fVar46,fVar57,fVar51);
                    fVar55 = (float)local_438._0_4_;
                    fVar48 = (float)local_498;
LAB_00131b80:
                    stbtt__handle_clipped_edge(pfVar22,x,psVar25,fVar48,fVar55,fVar52,fVar50);
                    fVar48 = fVar52;
                    goto LAB_00131b9a;
                  }
                  fVar55 = fVar46;
                  if (((fVar48 < fVar52) && (fVar52 < fVar56)) ||
                     ((fVar56 < fVar52 && (fVar52 < fVar48)))) goto LAB_00131b80;
                  fVar50 = fVar46;
                  if (((fVar48 < fVar57) && (fVar57 < fVar56)) ||
                     ((fVar56 < fVar57 && (fVar57 < fVar48)))) {
                    local_498 = CONCAT44(local_498._4_4_,fVar57);
                    local_438._0_4_ = fVar51;
                    goto LAB_00131ae5;
                  }
                }
                else {
                  local_498 = CONCAT44(local_498._4_4_,fVar57);
                  local_438._0_4_ = fVar51;
                  stbtt__handle_clipped_edge(pfVar22,x,psVar25,fVar48,fVar46,fVar52,fVar50);
                  fVar57 = (float)local_498;
                  fVar48 = fVar52;
                  fVar51 = (float)local_438._0_4_;
LAB_00131ae5:
                  stbtt__handle_clipped_edge(pfVar22,x,psVar25,fVar48,fVar50,fVar57,fVar51);
                  fVar50 = (float)local_438._0_4_;
                  fVar48 = (float)local_498;
LAB_00131b9a:
                  fVar56 = (float)local_428._0_4_;
                }
                stbtt__handle_clipped_edge(pfVar22,x,psVar25,fVar48,fVar50,fVar56,fVar47);
                fVar48 = (float)local_2f8._0_4_;
                fVar56 = (float)local_428._0_4_;
                x = x + 1;
              }
            }
            else if (fVar48 < local_444) {
              if (0.0 <= fVar48) {
                local_2f8 = ZEXT416((uint)fVar48);
                stbtt__handle_clipped_edge(pfVar22,(int)fVar48,psVar25,fVar48,fVar46,fVar48,fVar47);
                iVar18 = (int)fVar48 + 1;
                fVar48 = (float)local_2f8._0_4_;
              }
              else {
                iVar18 = 0;
              }
              stbtt__handle_clipped_edge(local_408,iVar18,psVar25,fVar48,fVar46,fVar48,fVar47);
            }
LAB_00131dd1:
          }
        }
        fVar46 = 0.0;
        lVar41 = local_2d0;
        pfVar23 = pfVar22;
        uVar27 = local_3c0;
        while (bVar44 = lVar41 != 0, lVar41 = lVar41 + -1, bVar44) {
          fVar46 = fVar46 + pfVar23[local_2a0];
          iVar18 = (int)(ABS(*pfVar23 + fVar46) * 255.0 + 0.5);
          uVar32 = (undefined1)iVar18;
          if (0xfe < iVar18) {
            uVar32 = 0xff;
          }
          *(undefined1 *)((long)local_330 + (long)(int)uVar27) = uVar32;
          uVar27 = (ulong)((int)uVar27 + 1);
          pfVar23 = pfVar23 + 1;
        }
        psVar25 = (stbtt__active_edge *)&active;
        while (psVar25 = psVar25->next, psVar25 != (stbtt__active_edge *)0x0) {
          psVar25->fx = psVar25->fdx + psVar25->fx;
        }
        uVar27 = (ulong)(local_3ac + 1);
        local_3c0 = (ulong)((int)local_3c0 + local_3fc);
        iVar18 = local_3b0;
        iVar20 = local_3f4 + 1;
      }
      while (pauVar43 = local_478, pfVar23 != (float *)0x0) {
        pfVar11 = *(float **)pfVar23;
        local_490 = (stbtt__active_edge *)0x1725fc;
        pcStack_488 = "stbtt__hheap_cleanup";
        pcStack_460 = (char *)0x0;
        local_480 = 0x52b3;
        local_458 = (ulong)local_458._4_4_ << 0x20;
        local_468 = pfVar23;
        (*(code *)in_FS_OFFSET[-0x85])(local_478,3);
        pfVar23 = pfVar11;
      }
      if (pfVar22 != scanline_data) {
        local_490 = (stbtt__active_edge *)0x1725fc;
        pcStack_488 = "stbtt__rasterize_sorted_edges";
        pcStack_460 = (char *)0x0;
        local_480 = 0x54b9;
        local_458 = (ulong)local_458._4_4_ << 0x20;
        local_468 = pfVar22;
        (*(code *)in_FS_OFFSET[-0x85])(local_478,3);
      }
      scanline_data._0_8_ = anon_var_dwarf_10442;
      scanline_data._8_8_ = anon_var_dwarf_13b0b;
      local_490 = (stbtt__active_edge *)local_440;
      pcStack_488 = (char *)0x0;
      scanline_data[4] = 3.06072e-41;
      scanline_data[5] = 0.0;
      local_480 = local_480 & 0xffffffff00000000;
      (*(code *)in_FS_OFFSET[-0x85])(pauVar43,3);
      prVar31 = local_410;
    }
    scanline_data._0_8_ = anon_var_dwarf_10442;
    scanline_data._8_8_ = anon_var_dwarf_13af3;
    local_490 = local_450;
    pcStack_488 = (char *)0x0;
    scanline_data[4] = 3.083e-41;
    scanline_data[5] = 0.0;
    local_480 = local_480 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(pauVar43,3);
    local_468 = (float *)0x1725fc;
    pcStack_460 = "stbtt_Rasterize";
    local_3e8 = local_3c8;
    pcStack_3e0 = (char *)0x0;
    local_458 = 0x55f2;
    local_3d8 = local_3d8 & 0xffffffff00000000;
    (*(code *)in_FS_OFFSET[-0x85])(pauVar43,3);
    lVar41 = local_328;
  }
LAB_00131078:
  pauVar43 = local_478;
  pfVar22 = (float *)((long)&prVar31->field_0 + lVar41);
  scanline_data._0_8_ = anon_var_dwarf_10442;
  scanline_data._8_8_ = anon_var_dwarf_13acf;
  local_490 = (stbtt__active_edge *)vertices;
  pcStack_488 = (char *)0x0;
  scanline_data[4] = 3.09295e-41;
  scanline_data[5] = 0.0;
  local_480 = local_480 & 0xffffffff00000000;
  (*(code *)in_FS_OFFSET[-0x85])(local_478);
  lVar41 = (ulong)(uint)((int)local_2e8 * local_3f8 + local_46c) << 0x20;
  for (lVar35 = 0; (float)lVar35 < pfVar22[3]; lVar35 = lVar35 + 1) {
    lVar29 = lVar41;
    for (lVar33 = 0; (float)lVar33 < pfVar22[2]; lVar33 = lVar33 + 1) {
      bVar10 = *(byte *)((long)local_330 + lVar33 + (int)pfVar22[2] * lVar35);
      bVar12 = bVar10;
      if (0x50 < bVar10) {
        bVar12 = 0;
      }
      if (antialias != RF_FONT_NO_ANTIALIAS) {
        bVar12 = bVar10;
      }
      *(undefined1 *)((long)dst + (lVar29 >> 0x1f)) = 0xff;
      *(byte *)((long)dst + (lVar29 >> 0x1f) + 1) = bVar12;
      lVar29 = lVar29 + 0x100000000;
    }
    lVar41 = lVar41 + local_2a8;
  }
  *pfVar22 = (float)local_46c;
  pfVar22[1] = (float)local_3f8;
  fVar46 = pfVar22[2] + local_3b4 + (float)local_46c;
  in_XMM2_Da = (local_3b8 - pfVar22[2]) - local_3b4;
  if (in_XMM2_Da <= (float)(int)fVar46) {
    local_46c = (int)local_348;
    iVar20 = local_3d0->font_size + local_46c;
    iVar18 = local_3f8 + iVar20;
    if ((int)(local_470 - iVar20) < iVar18) goto LAB_0013214b;
  }
  else {
    local_46c = (int)fVar46;
    iVar18 = local_3f8;
  }
  uVar27 = local_338 + 1;
  in_XMM3_Da = local_3b4;
  goto LAB_00130b01;
}

Assistant:

RF_API rf_image rf_generate_ttf_font_atlas(rf_ttf_font_info* font_info, int atlas_width, int padding, rf_glyph_info* glyphs, rf_int glyphs_count, rf_font_antialias antialias, unsigned short* dst, rf_int dst_count, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (font_info && font_info->valid)
    {
        int atlas_pixel_count = atlas_width * atlas_width;

        if (dst && dst_count >= atlas_pixel_count)
        {
            memset(dst, 0, atlas_pixel_count * 2);

            int largest_glyph_size = 0;
            for (rf_int i = 0; i < glyphs_count; i++)
            {
                int area = glyphs[i].width * glyphs[i].height;
                if (area > largest_glyph_size)
                {
                    largest_glyph_size = area;
                }
            }

            // Allocate a grayscale buffer large enough to store the largest glyph
            unsigned char* glyph_buffer = RF_ALLOC(temp_allocator, largest_glyph_size);

            // Use basic packing algorithm to generate the atlas
            if (glyph_buffer)
            {
                // We update these for every pixel in the loop
                int offset_x = RF_BUILTIN_FONT_PADDING;
                int offset_y = RF_BUILTIN_FONT_PADDING;

                // Set the allocator for stbtt
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(temp_allocator);
                {
                    // Using simple packaging, one char after another
                    for (rf_int i = 0; i < glyphs_count; i++)
                    {
                        // Extract these variables to shorter names
                        stbtt_fontinfo* stbtt_ctx = (stbtt_fontinfo*) &font_info->internal_stb_font_info;

                        // Get glyph bitmap
                        stbtt_MakeCodepointBitmap(stbtt_ctx, glyph_buffer, glyphs[i].width, glyphs[i].height, glyphs[i].width, font_info->scale_factor, font_info->scale_factor, glyphs[i].codepoint);

                        // Copy pixel data from fc.data to atlas
                        for (rf_int y = 0; y < glyphs[i].height; y++)
                        {
                            for (rf_int x = 0; x < glyphs[i].width; x++)
                            {
                                unsigned char glyph_pixel = glyph_buffer[y * ((int)glyphs[i].width) + x];
                                if (antialias == RF_FONT_NO_ANTIALIAS && glyph_pixel > RF_BITMAP_ALPHA_THRESHOLD) glyph_pixel = 0;

                                int dst_index = (offset_y + y) * atlas_width + (offset_x + x);
                                // dst is in RF_UNCOMPRESSED_GRAY_ALPHA which is 2 bytes
                                // for fonts we write the glyph_pixel in the alpha channel which is byte 2
                                ((unsigned char*)(&dst[dst_index]))[0] = 255;
                                ((unsigned char*)(&dst[dst_index]))[1] = glyph_pixel;
                            }
                        }

                        // Fill chars rectangles in atlas info
                        glyphs[i].x = (float)offset_x;
                        glyphs[i].y = (float)offset_y;

                        // Move atlas position X for next character drawing
                        offset_x += (glyphs[i].width + 2 * padding);
                        if (offset_x >= (atlas_width - glyphs[i].width - 2 * padding))
                        {
                            offset_x  = padding;
                            offset_y += font_info->font_size + padding;

                            if (offset_y > (atlas_width - font_info->font_size - padding)) break;
                            //else error dst buffer is not big enough
                        }
                    }
                }
                RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

                result.data   = dst;
                result.width  = atlas_width;
                result.height = atlas_width;
                result.format = RF_UNCOMPRESSED_GRAY_ALPHA;
                result.valid  = true;
            }

            RF_FREE(temp_allocator, glyph_buffer);
        }
    }

    return result;
}